

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O0

int dwarf_formblock(Dwarf_Attribute attr,Dwarf_Block **return_block,Dwarf_Error *error)

{
  Dwarf_Error pDVar1;
  int res;
  Dwarf_Block *out_block;
  Dwarf_Block local_block;
  Dwarf_Debug dbg;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Error *error_local;
  Dwarf_Block **return_block_local;
  Dwarf_Attribute attr_local;
  
  dbg = (Dwarf_Debug)0x0;
  local_block.bl_section_offset = 0;
  cu_context = (Dwarf_CU_Context_conflict)error;
  error_local = (Dwarf_Error *)return_block;
  return_block_local = (Dwarf_Block **)attr;
  memset(&out_block,0,0x20);
  attr_local._4_4_ =
       get_attr_dbg((Dwarf_Debug *)&local_block.bl_section_offset,(Dwarf_CU_Context_conflict *)&dbg,
                    (Dwarf_Attribute)return_block_local,(Dwarf_Error *)cu_context);
  if ((attr_local._4_4_ == 0) &&
     (attr_local._4_4_ =
           _dwarf_formblock_internal
                     ((Dwarf_Debug)local_block.bl_section_offset,(Dwarf_Attribute)return_block_local
                      ,(Dwarf_CU_Context_conflict)dbg,(Dwarf_Block *)&out_block,
                      (Dwarf_Error *)cu_context), attr_local._4_4_ == 0)) {
    pDVar1 = (Dwarf_Error)_dwarf_get_alloc((Dwarf_Debug)local_block.bl_section_offset,'\x06',1);
    if (pDVar1 == (Dwarf_Error)0x0) {
      _dwarf_error((Dwarf_Debug)local_block.bl_section_offset,(Dwarf_Error *)cu_context,0x3e);
      attr_local._4_4_ = 1;
    }
    else {
      pDVar1->er_errval = (Dwarf_Signed)out_block;
      pDVar1->er_msg = (void *)local_block.bl_len;
      *(Dwarf_Ptr *)&pDVar1->er_static_alloc = local_block.bl_data;
      pDVar1[1].er_errval = local_block._16_8_;
      *error_local = pDVar1;
      attr_local._4_4_ = 0;
    }
  }
  return attr_local._4_4_;
}

Assistant:

int
dwarf_formblock(Dwarf_Attribute attr,
    Dwarf_Block ** return_block, Dwarf_Error * error)
{
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Block local_block;
    Dwarf_Block *out_block = 0;
    int res = 0;

    memset(&local_block,0,sizeof(local_block));
    res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_formblock_internal(dbg,attr,
        cu_context, &local_block, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    out_block = (Dwarf_Block *)
        _dwarf_get_alloc(dbg, DW_DLA_BLOCK, 1);
    if (!out_block) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    *out_block = local_block;
    *return_block = out_block;
    return DW_DLV_OK;
}